

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmapfile.cpp
# Opt level: O1

void __thiscall MemoryMappedFile::~MemoryMappedFile(MemoryMappedFile *this)

{
  munmap(this->baseAddress,this->fileSize);
  close(this->file);
  return;
}

Assistant:

MemoryMappedFile::~MemoryMappedFile()
{
#ifdef _WIN32
	if (baseAddress != nullptr)
		UnmapViewOfFile(baseAddress);
	if (mapping != INVALID_HANDLE_VALUE)
		CloseHandle(mapping);
	if (file != INVALID_HANDLE_VALUE)
		CloseHandle(file);
#else
    munmap(baseAddress, fileSize);
    close(file);
#endif
}